

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

int fixupReg(InternalInstruction *insn,OperandSpecifier *op)

{
  byte bVar1;
  uint uVar2;
  EABase EVar3;
  uint8_t uVar4;
  int iVar5;
  uint8_t local_19;
  
  bVar1 = op->encoding;
  if (6 < bVar1 - 2) {
    if (bVar1 == 1) {
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->reg - (char)insn->regBase,&local_19);
      insn->reg = (uint)bVar1;
    }
    else {
      if (bVar1 != 9) {
        return -1;
      }
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->vvvv,&local_19);
      insn->vvvv = (uint)bVar1;
    }
    if (local_19 != '\0') {
      return 0;
    }
    return -1;
  }
  EVar3 = insn->eaBase;
  uVar2 = EVar3 - insn->eaRegBase;
  if (EVar3 < insn->eaRegBase) {
    return 0;
  }
  bVar1 = 7;
  switch(op->type) {
  case '9':
    uVar4 = '\x02';
    goto LAB_001a0633;
  case ':':
    uVar4 = '\x04';
    goto LAB_001a0633;
  case ';':
    uVar4 = '\b';
LAB_001a0633:
    insn->operandSize = uVar4;
    EVar3 = (uVar2 & 7) + EA_REG_MM0;
    goto switchD_001a051d_caseD_4e;
  case '<':
    uVar4 = '\x02';
    break;
  case '=':
    uVar4 = '\x04';
    break;
  case '>':
    uVar4 = '\b';
    break;
  case '?':
    uVar4 = '\x10';
    break;
  case '@':
    iVar5 = 0x9d;
    uVar4 = ' ';
    goto LAB_001a065f;
  case 'A':
    iVar5 = 0xbd;
    uVar4 = '@';
    goto LAB_001a065f;
  case 'B':
  case 'E':
  case 'F':
    iVar5 = 0xdd;
    goto LAB_001a05f0;
  case 'C':
  case 'D':
  case 'G':
  case 'H':
  case 'I':
  case 'M':
switchD_001a051d_caseD_43:
    insn->eaBase = EA_BASE_NONE;
    return -1;
  case 'J':
    iVar5 = 0xe5;
    bVar1 = 5;
    goto LAB_001a05f0;
  case 'K':
    iVar5 = 0xeb;
LAB_001a05f0:
    insn->eaBase = uVar2 + iVar5 & EA_REG_CR12;
    if ((byte)uVar2 <= bVar1) {
      return 0;
    }
    return -1;
  case 'L':
    iVar5 = 0xf3;
LAB_001a064b:
    uVar4 = '\x04';
    goto LAB_001a065f;
  case 'N':
    goto switchD_001a051d_caseD_4e;
  default:
    switch(op->type) {
    case '\b':
      insn->operandSize = '\x01';
      if ((((byte)uVar2 & 0xfc) == 4) && (insn->rexPrefix != '\0')) {
        EVar3 = uVar2 + EA_REG_R12B;
      }
      else {
        EVar3 = uVar2 + EA_REG_AL;
      }
      goto switchD_001a051d_caseD_4e;
    case '\t':
      iVar5 = 0x45;
      uVar4 = '\x02';
      break;
    case '\n':
      iVar5 = 0x55;
      goto LAB_001a064b;
    case '\v':
      iVar5 = 0x65;
      uVar4 = '\b';
      break;
    default:
      goto switchD_001a051d_caseD_43;
    }
LAB_001a065f:
    insn->operandSize = uVar4;
    EVar3 = uVar2 + iVar5;
    goto switchD_001a051d_caseD_4e;
  }
  insn->operandSize = uVar4;
  EVar3 = uVar2 + EA_REG_XMM0;
switchD_001a051d_caseD_4e:
  insn->eaBase = EVar3 & EA_REG_CR12;
  return 0;
}

Assistant:

static int fixupReg(struct InternalInstruction *insn,
		const struct OperandSpecifier *op)
{
	uint8_t valid;

	// dbgprintf(insn, "fixupReg()");

	switch ((OperandEncoding)op->encoding) {
		default:
			//debug("Expected a REG or R/M encoding in fixupReg");
			return -1;
		case ENCODING_VVVV:
			insn->vvvv = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					insn->vvvv,
					&valid);
			if (!valid)
				return -1;
			break;
		case ENCODING_REG:
			insn->reg = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					(uint8_t)(insn->reg - insn->regBase),
					&valid);
			if (!valid)
				return -1;
			break;
		CASE_ENCODING_RM:
			if (insn->eaBase >= insn->eaRegBase) {
				insn->eaBase = (EABase)fixupRMValue(insn,
						(OperandType)op->type,
						(uint8_t)(insn->eaBase - insn->eaRegBase),
						&valid);
				if (!valid)
					return -1;
			}
			break;
	}

	return 0;
}